

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

SizeRange * __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::mutable_widthrange
          (ImageFeatureType_ImageSizeRange *this)

{
  SizeRange *this_00;
  
  this_00 = this->widthrange_;
  if (this_00 == (SizeRange *)0x0) {
    this_00 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_00);
    this->widthrange_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SizeRange* ImageFeatureType_ImageSizeRange::mutable_widthrange() {
  
  if (widthrange_ == NULL) {
    widthrange_ = new ::CoreML::Specification::SizeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.ImageSizeRange.widthRange)
  return widthrange_;
}